

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tipc_listener.cpp
# Opt level: O1

int __thiscall
zmq::tipc_listener_t::accept(tipc_listener_t *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint __fd_00;
  int iVar1;
  uint *puVar2;
  socklen_t *__addr_len_00;
  undefined4 in_register_00000034;
  sockaddr *__addr_00;
  socklen_t ss_len;
  sockaddr_storage ss;
  socklen_t local_8c;
  sockaddr local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88.sa_family = 0;
  local_88.sa_data[0] = '\0';
  local_88.sa_data[1] = '\0';
  local_88.sa_data[2] = '\0';
  local_88.sa_data[3] = '\0';
  local_88.sa_data[4] = '\0';
  local_88.sa_data[5] = '\0';
  local_88.sa_data[6] = '\0';
  local_88.sa_data[7] = '\0';
  local_88.sa_data[8] = '\0';
  local_88.sa_data[9] = '\0';
  local_88.sa_data[10] = '\0';
  local_88.sa_data[0xb] = '\0';
  local_88.sa_data[0xc] = '\0';
  local_88.sa_data[0xd] = '\0';
  local_8c = 0x80;
  if ((this->super_stream_listener_base_t)._s == -1) {
    accept((int)this,(sockaddr *)CONCAT44(in_register_00000034,__fd),(socklen_t *)__addr);
  }
  __addr_00 = &local_88;
  iVar1 = ::accept((this->super_stream_listener_base_t)._s,__addr_00,&local_8c);
  if (iVar1 == -1) {
    puVar2 = (uint *)__errno_location();
    __fd_00 = *puVar2;
    iVar1 = -1;
    if (((0x18 < __fd_00) || ((0x1800810U >> (__fd_00 & 0x1f) & 1) == 0)) &&
       ((0x22 < __fd_00 - 0x47 || ((0x500000001U >> ((ulong)(__fd_00 - 0x47) & 0x3f) & 1) == 0)))) {
      accept(__fd_00,__addr_00,__addr_len_00);
    }
  }
  return iVar1;
}

Assistant:

zmq::fd_t zmq::tipc_listener_t::accept ()
{
    //  Accept one connection and deal with different failure modes.
    //  The situation where connection cannot be accepted due to insufficient
    //  resources is considered valid and treated by ignoring the connection.
    struct sockaddr_storage ss = {};
    socklen_t ss_len = sizeof (ss);

    zmq_assert (_s != retired_fd);
#ifdef ZMQ_HAVE_VXWORKS
    fd_t sock = ::accept (_s, (struct sockaddr *) &ss, (int *) &ss_len);
#else
    fd_t sock =
      ::accept (_s, reinterpret_cast<struct sockaddr *> (&ss), &ss_len);
#endif
    if (sock == -1) {
        errno_assert (errno == EAGAIN || errno == EWOULDBLOCK
                      || errno == ENOBUFS || errno == EINTR
                      || errno == ECONNABORTED || errno == EPROTO
                      || errno == EMFILE || errno == ENFILE);
        return retired_fd;
    }
    /*FIXME Accept filters?*/
    return sock;
}